

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

void __thiscall
submitblock_StateCatcher::BlockChecked
          (submitblock_StateCatcher *this,CBlock *block,BlockValidationState *stateIn)

{
  bool bVar1;
  long in_FS_OFFSET;
  base_blob<256U> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash((uint256 *)&local_40,&block->super_CBlockHeader);
  bVar1 = operator!=(&local_40,&(this->hash).super_base_blob<256U>);
  if (!bVar1) {
    this->found = true;
    ValidationState<BlockValidationResult>::operator=
              (&(this->state).super_ValidationState<BlockValidationResult>,
               &stateIn->super_ValidationState<BlockValidationResult>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockChecked(const CBlock& block, const BlockValidationState& stateIn) override {
        if (block.GetHash() != hash)
            return;
        found = true;
        state = stateIn;
    }